

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O0

void mpmc_pointer_basics<int*,4ul>(void)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  byte extraout_AL_05;
  byte extraout_AL_06;
  byte extraout_AL_07;
  byte extraout_AL_08;
  byte extraout_AL_09;
  byte extraout_AL_10;
  byte extraout_AL_11;
  byte extraout_AL_12;
  int *data_00;
  Expression_lhs<const_bool> this;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  Expression_lhs<const_unsigned_long> EVar2;
  Expression_lhs<int_*const> EVar3;
  ResultBuilder DOCTEST_RB_13;
  ResultBuilder DOCTEST_RB_12;
  ResultBuilder DOCTEST_RB_11;
  ResultBuilder DOCTEST_RB_10;
  size_t i_3;
  ResultBuilder DOCTEST_RB_9;
  size_t i_2;
  ResultBuilder DOCTEST_RB_8;
  ResultBuilder DOCTEST_RB_7;
  ResultBuilder DOCTEST_RB_6;
  size_t i_1;
  ResultBuilder DOCTEST_RB_5;
  ResultBuilder DOCTEST_RB_4;
  ResultBuilder DOCTEST_RB_3;
  size_t i;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> data;
  size_t N;
  MPMC<int_*,_4UL> mpmc;
  Result *pRVar4;
  ResultBuilder *in_stack_fffffffffffff108;
  undefined4 in_stack_fffffffffffff110;
  int in_stack_fffffffffffff114;
  allocator_type *in_stack_fffffffffffff118;
  undefined4 in_stack_fffffffffffff120;
  Enum in_stack_fffffffffffff124;
  ResultBuilder *in_stack_fffffffffffff128;
  MPMC<int_*,_4UL> *in_stack_fffffffffffff138;
  MPMC<int_*,_4UL> *in_stack_fffffffffffff148;
  undefined7 in_stack_fffffffffffff188;
  undefined1 in_stack_fffffffffffff18f;
  byte bVar5;
  Expression_lhs<int_*const> *in_stack_fffffffffffff190;
  MPMC<int_*,_4UL> *this_00;
  MPMC<int_*,_4UL> *in_stack_fffffffffffff290;
  ExpressionDecomposer local_d4c;
  int *local_d48;
  Enum local_d40;
  ResultBuilder local_d18;
  undefined1 local_c9e;
  undefined1 local_c9d;
  ExpressionDecomposer local_c9c;
  Expression_lhs<const_bool> local_c98;
  ResultBuilder local_c70;
  reference local_bf8;
  int *local_bf0;
  Enum local_be8;
  int *local_be0;
  ExpressionDecomposer local_bd4;
  int *local_bd0;
  Enum local_bc8;
  ResultBuilder local_ba0;
  undefined1 local_b26;
  undefined1 local_b25;
  ExpressionDecomposer local_b24;
  Expression_lhs<const_bool> local_b20;
  ResultBuilder local_af8;
  ulong local_a80;
  undefined1 local_a76;
  undefined1 local_a75;
  ExpressionDecomposer local_a74;
  Expression_lhs<const_bool> local_a70;
  ResultBuilder local_a48;
  size_type local_9d0;
  undefined8 local_9c8;
  int *local_9c0;
  Enum local_9b8;
  int *local_9b0;
  ExpressionDecomposer local_9a4;
  int *local_9a0;
  Enum local_998;
  ResultBuilder local_970;
  undefined1 local_8f6;
  undefined1 local_8f5;
  ExpressionDecomposer local_8f4;
  Expression_lhs<const_bool> local_8f0;
  ResultBuilder local_8c8;
  reference local_850;
  int *local_848;
  Enum local_840;
  int *local_838;
  ExpressionDecomposer local_82c;
  int *local_828;
  Enum local_820;
  ResultBuilder local_7f8;
  ulong local_780;
  undefined1 local_776;
  undefined1 local_775;
  ExpressionDecomposer local_774;
  Expression_lhs<const_bool> local_770;
  ResultBuilder local_748;
  undefined1 local_6ce;
  undefined1 local_6cd;
  ExpressionDecomposer local_6cc;
  Expression_lhs<const_bool> local_6c8;
  ResultBuilder local_6a0;
  undefined1 local_626;
  undefined1 local_625;
  ExpressionDecomposer local_624;
  Expression_lhs<const_bool> local_620;
  ResultBuilder local_5f8;
  ulong local_580;
  undefined8 local_578;
  int *local_570;
  Enum local_568;
  int *local_560;
  ExpressionDecomposer local_554;
  int *local_550;
  Enum local_548;
  ResultBuilder local_520;
  undefined1 local_4a6;
  undefined1 local_4a5;
  ExpressionDecomposer local_4a4;
  Expression_lhs<const_bool> local_4a0;
  ResultBuilder local_478;
  unsigned_long local_400;
  Enum local_3f8;
  size_t local_3f0;
  ExpressionDecomposer local_3e4;
  unsigned_long local_3e0;
  Enum local_3d8;
  ResultBuilder local_3b0;
  undefined1 local_321 [25];
  ulong local_308;
  MPMC<int_*,_4UL> local_300;
  
  tf::MPMC<int_*,_4UL>::MPMC(in_stack_fffffffffffff148);
  local_308 = 0x10;
  data_00 = (int *)0x11;
  this_00 = (MPMC<int_*,_4UL> *)local_321;
  std::allocator<int>::allocator((allocator<int> *)0x1a5230);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff128,
             CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120),in_stack_fffffffffffff118
            );
  std::allocator<int>::~allocator((allocator<int> *)0x1a525c);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118,
             in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
             (char *)in_stack_fffffffffffff138);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3e4,DT_REQUIRE);
  local_3f0 = tf::MPMC<int_*,_4UL>::capacity(&local_300);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)in_stack_fffffffffffff108,(unsigned_long *)pRVar4);
  local_400 = EVar2.lhs;
  local_3f8 = EVar2.m_at;
  local_3e0 = local_400;
  local_3d8 = local_3f8;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffff190,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1a5370);
  doctest::detail::ResultBuilder::log(&local_3b0,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a548b);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118,
             in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
             (char *)in_stack_fffffffffffff138);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4a4,DT_REQUIRE);
  local_4a5 = tf::MPMC<int_*,_4UL>::empty(in_stack_fffffffffffff138);
  local_4a0 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                         (bool *)in_stack_fffffffffffff108);
  local_4a6 = 1;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
             (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1a5577);
  doctest::detail::ResultBuilder::log(&local_478,__x_00);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a5662);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118,
             in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
             (char *)in_stack_fffffffffffff138);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_554,DT_REQUIRE);
  local_560 = tf::MPMC<int_*,_4UL>::try_dequeue(this_00);
  EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)in_stack_fffffffffffff108,(int **)pRVar4);
  local_570 = EVar3.lhs;
  local_568 = EVar3.m_at;
  local_578 = 0;
  local_550 = local_570;
  local_548 = local_568;
  doctest::detail::Expression_lhs<int*const>::operator==
            (in_stack_fffffffffffff190,
             (void **)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1a5786);
  doctest::detail::ResultBuilder::log(&local_520,__x_01);
  if ((extraout_AL_01 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a5871);
  for (local_580 = 0; local_580 < local_308; local_580 = local_580 + 1) {
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118
               ,in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
               (char *)in_stack_fffffffffffff138);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_624,DT_REQUIRE);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(local_321 + 1),local_580);
    local_625 = tf::MPMC<int_*,_4UL>::try_enqueue(this_00,data_00);
    local_620 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                           (bool *)in_stack_fffffffffffff108);
    local_626 = 1;
    doctest::detail::Expression_lhs<bool_const>::operator==
              ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
               (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
    doctest::detail::Result::~Result((Result *)0x1a5997);
    doctest::detail::ResultBuilder::log(&local_5f8,__x_02);
    if ((extraout_AL_02 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a5a7c);
  }
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118,
             in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
             (char *)in_stack_fffffffffffff138);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_6cc,DT_REQUIRE);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(local_321 + 1),local_308);
  local_6cd = tf::MPMC<int_*,_4UL>::try_enqueue(this_00,data_00);
  local_6c8 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                         (bool *)in_stack_fffffffffffff108);
  local_6ce = 0;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
             (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1a5bad);
  doctest::detail::ResultBuilder::log(&local_6a0,__x_03);
  if ((extraout_AL_03 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a5c86);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118,
             in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
             (char *)in_stack_fffffffffffff138);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_774,DT_REQUIRE);
  local_775 = tf::MPMC<int_*,_4UL>::empty(in_stack_fffffffffffff138);
  local_770 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                         (bool *)in_stack_fffffffffffff108);
  local_776 = 0;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
             (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
  doctest::detail::Result::~Result((Result *)0x1a5d72);
  doctest::detail::ResultBuilder::log(&local_748,__x_04);
  if ((extraout_AL_04 & 1) == 0) {
    doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a5e5d);
    for (local_780 = 0; local_780 < local_308; local_780 = local_780 + 1) {
      pRVar4 = (Result *)0x1d33b6;
      doctest::detail::ResultBuilder::ResultBuilder
                (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                 (char *)in_stack_fffffffffffff118,in_stack_fffffffffffff114,
                 (char *)in_stack_fffffffffffff108,"",(char *)in_stack_fffffffffffff138);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_82c,DT_REQUIRE);
      local_838 = tf::MPMC<int_*,_4UL>::try_dequeue(this_00);
      EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)in_stack_fffffffffffff108,(int **)pRVar4);
      local_848 = EVar3.lhs;
      local_840 = EVar3.m_at;
      local_828 = local_848;
      local_820 = local_840;
      local_850 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(local_321 + 1),local_780);
      doctest::detail::Expression_lhs<int*const>::operator==
                (in_stack_fffffffffffff190,
                 (int **)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
      doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
      doctest::detail::Result::~Result((Result *)0x1a5fb4);
      doctest::detail::ResultBuilder::log(&local_7f8,__x_05);
      if ((extraout_AL_05 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a6099);
    }
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118
               ,in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
               (char *)in_stack_fffffffffffff138);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_8f4,DT_REQUIRE);
    local_8f5 = tf::MPMC<int_*,_4UL>::empty(in_stack_fffffffffffff138);
    local_8f0 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                           (bool *)in_stack_fffffffffffff108);
    local_8f6 = 1;
    doctest::detail::Expression_lhs<bool_const>::operator==
              ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
               (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
    doctest::detail::Result::~Result((Result *)0x1a61b2);
    doctest::detail::ResultBuilder::log(&local_8c8,__x_06);
    if ((extraout_AL_06 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a628b);
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffff128,in_stack_fffffffffffff124,(char *)in_stack_fffffffffffff118
               ,in_stack_fffffffffffff114,(char *)in_stack_fffffffffffff108,"",
               (char *)in_stack_fffffffffffff138);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_9a4,DT_REQUIRE);
    local_9b0 = tf::MPMC<int_*,_4UL>::try_dequeue(this_00);
    EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                      ((ExpressionDecomposer *)in_stack_fffffffffffff108,(int **)pRVar4);
    local_9c0 = EVar3.lhs;
    local_9b8 = EVar3.m_at;
    local_9c8 = 0;
    local_9a0 = local_9c0;
    local_998 = local_9b8;
    doctest::detail::Expression_lhs<int*const>::operator==
              (in_stack_fffffffffffff190,
               (void **)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
    doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
    doctest::detail::Result::~Result((Result *)0x1a63af);
    doctest::detail::ResultBuilder::log(&local_970,__x_07);
    if ((extraout_AL_07 & 1) == 0) {
      doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a6494);
      for (local_9d0 = 0; local_9d0 < local_308; local_9d0 = local_9d0 + 1) {
        std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)(local_321 + 1),local_9d0);
        tf::MPMC<int_*,_4UL>::enqueue(in_stack_fffffffffffff290,(int *)this_00);
      }
      pRVar4 = (Result *)0x1d33b6;
      doctest::detail::ResultBuilder::ResultBuilder
                (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                 (char *)in_stack_fffffffffffff118,in_stack_fffffffffffff114,
                 (char *)in_stack_fffffffffffff108,"",(char *)in_stack_fffffffffffff138);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_a74,DT_REQUIRE);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(local_321 + 1),local_308);
      local_a75 = tf::MPMC<int_*,_4UL>::try_enqueue(this_00,data_00);
      local_a70 = doctest::detail::ExpressionDecomposer::operator<<
                            ((ExpressionDecomposer *)
                             CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                             (bool *)in_stack_fffffffffffff108);
      local_a76 = 0;
      doctest::detail::Expression_lhs<bool_const>::operator==
                ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
                 (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
      doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
      doctest::detail::Result::~Result((Result *)0x1a6607);
      doctest::detail::ResultBuilder::log(&local_a48,__x_08);
      if ((extraout_AL_08 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a66e0);
      local_a80 = 0;
      while( true ) {
        if (local_308 <= local_a80) {
          pRVar4 = (Result *)0x1d33b6;
          doctest::detail::ResultBuilder::ResultBuilder
                    (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                     (char *)in_stack_fffffffffffff118,in_stack_fffffffffffff114,
                     (char *)in_stack_fffffffffffff108,"",(char *)in_stack_fffffffffffff138);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_c9c,DT_REQUIRE);
          local_c9d = tf::MPMC<int_*,_4UL>::empty(in_stack_fffffffffffff138);
          this = doctest::detail::ExpressionDecomposer::operator<<
                           ((ExpressionDecomposer *)
                            CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                            (bool *)in_stack_fffffffffffff108);
          local_c9e = 1;
          local_c98 = this;
          doctest::detail::Expression_lhs<bool_const>::operator==
                    ((Expression_lhs<const_bool> *)this,
                     (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
          doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
          doctest::detail::Result::~Result((Result *)0x1a6c0c);
          doctest::detail::ResultBuilder::log(&local_c70,__x_11);
          if ((extraout_AL_11 & 1) != 0) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          bVar5 = extraout_AL_11;
          doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
          doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a6ce5);
          pRVar4 = (Result *)0x1d33b6;
          doctest::detail::ResultBuilder::ResultBuilder
                    (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                     (char *)in_stack_fffffffffffff118,in_stack_fffffffffffff114,
                     (char *)in_stack_fffffffffffff108,"",(char *)in_stack_fffffffffffff138);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d4c,DT_REQUIRE);
          tf::MPMC<int_*,_4UL>::try_dequeue(this_00);
          EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                            ((ExpressionDecomposer *)in_stack_fffffffffffff108,(int **)pRVar4);
          local_d48 = EVar3.lhs;
          local_d40 = EVar3.m_at;
          doctest::detail::Expression_lhs<int*const>::operator==
                    ((Expression_lhs<int_*const> *)this,
                     (void **)CONCAT17(bVar5,in_stack_fffffffffffff188));
          doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
          doctest::detail::Result::~Result((Result *)0x1a6dfd);
          doctest::detail::ResultBuilder::log(&local_d18,__x_12);
          if ((extraout_AL_12 & 1) == 0) {
            doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
            doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a6edc);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff118);
            return;
          }
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        pRVar4 = (Result *)0x1d33b6;
        doctest::detail::ResultBuilder::ResultBuilder
                  (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                   (char *)in_stack_fffffffffffff118,in_stack_fffffffffffff114,
                   (char *)in_stack_fffffffffffff108,"",(char *)in_stack_fffffffffffff138);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_b24,DT_REQUIRE);
        local_b25 = tf::MPMC<int_*,_4UL>::empty(in_stack_fffffffffffff138);
        local_b20 = doctest::detail::ExpressionDecomposer::operator<<
                              ((ExpressionDecomposer *)
                               CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110),
                               (bool *)in_stack_fffffffffffff108);
        local_b26 = 0;
        doctest::detail::Expression_lhs<bool_const>::operator==
                  ((Expression_lhs<const_bool> *)in_stack_fffffffffffff190,
                   (bool *)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
        doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
        doctest::detail::Result::~Result((Result *)0x1a67ee);
        doctest::detail::ResultBuilder::log(&local_af8,__x_09);
        if ((extraout_AL_09 & 1) != 0) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a68d9);
        pRVar4 = (Result *)0x1d33b6;
        doctest::detail::ResultBuilder::ResultBuilder
                  (in_stack_fffffffffffff128,in_stack_fffffffffffff124,
                   (char *)in_stack_fffffffffffff118,in_stack_fffffffffffff114,
                   (char *)in_stack_fffffffffffff108,"",(char *)in_stack_fffffffffffff138);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_bd4,DT_REQUIRE);
        local_be0 = tf::MPMC<int_*,_4UL>::try_dequeue(this_00);
        EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)in_stack_fffffffffffff108,(int **)pRVar4);
        local_bf0 = EVar3.lhs;
        local_be8 = EVar3.m_at;
        local_bd0 = local_bf0;
        local_bc8 = local_be8;
        local_bf8 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(local_321 + 1),local_a80);
        doctest::detail::Expression_lhs<int*const>::operator==
                  (in_stack_fffffffffffff190,
                   (int **)CONCAT17(in_stack_fffffffffffff18f,in_stack_fffffffffffff188));
        doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff108,pRVar4);
        doctest::detail::Result::~Result((Result *)0x1a6a0e);
        doctest::detail::ResultBuilder::log(&local_ba0,__x_10);
        if ((extraout_AL_10 & 1) != 0) break;
        doctest::detail::ResultBuilder::react(in_stack_fffffffffffff108);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1a6af3);
        local_a80 = local_a80 + 1;
      }
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void mpmc_pointer_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<std::remove_pointer_t<T>> data(N+1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(&data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(&data[i]);
  }
  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);
}